

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O1

bool group_like(Am_Object *object)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Am_Object local_30;
  Am_Object local_28;
  
  bVar1 = Am_Is_Group_Or_Map(object);
  bVar3 = true;
  if (!bVar1) {
    Am_Object::Am_Object(&local_28,&Am_Window);
    bVar2 = Am_Object::Is_Instance_Of(object,&local_28);
    if (!bVar2) {
      Am_Object::Am_Object(&local_30,&Am_Screen);
      bVar3 = Am_Object::Is_Instance_Of(object,&local_30);
      bVar2 = true;
      goto LAB_001b2110;
    }
  }
  bVar2 = false;
LAB_001b2110:
  if (bVar2) {
    Am_Object::~Am_Object(&local_30);
  }
  if (!bVar1) {
    Am_Object::~Am_Object(&local_28);
  }
  return bVar3;
}

Assistant:

inline bool
group_like(Am_Object object)
{
  return (Am_Is_Group_Or_Map(object) || object.Is_Instance_Of(Am_Window) ||
          object.Is_Instance_Of(Am_Screen));
}